

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

rawSeq maybeSplitSequence(rawSeqStore_t *rawSeqStore,U32 remaining,U32 minMatch)

{
  rawSeq rVar1;
  rawSeq *prVar2;
  U32 minMatch_local;
  U32 remaining_local;
  rawSeqStore_t *rawSeqStore_local;
  uint uStack_10;
  rawSeq sequence;
  
  prVar2 = rawSeqStore->seq + rawSeqStore->pos;
  rawSeqStore_local._4_4_ = prVar2->offset;
  uStack_10 = prVar2->litLength;
  sequence.offset = prVar2->matchLength;
  if (rawSeqStore_local._4_4_ == 0) {
    __assert_fail("sequence.offset > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x454a,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
  }
  if (remaining < uStack_10 + sequence.offset) {
    if (uStack_10 < remaining) {
      if ((remaining < uStack_10 + sequence.offset) &&
         (sequence.offset = remaining - uStack_10, sequence.offset < minMatch)) {
        stack0xffffffffffffffec = (ulong)uStack_10 << 0x20;
      }
    }
    else {
      stack0xffffffffffffffec = (ulong)uStack_10 << 0x20;
    }
    ZSTD_ldm_skipSequences(rawSeqStore,(ulong)remaining,minMatch);
  }
  else {
    rawSeqStore->pos = rawSeqStore->pos + 1;
  }
  rVar1.matchLength = sequence.offset;
  rVar1.offset = rawSeqStore_local._4_4_;
  rVar1.litLength = uStack_10;
  return rVar1;
}

Assistant:

static rawSeq maybeSplitSequence(rawSeqStore_t* rawSeqStore,
                                 U32 const remaining, U32 const minMatch)
{
    rawSeq sequence = rawSeqStore->seq[rawSeqStore->pos];
    assert(sequence.offset > 0);
    /* Likely: No partial sequence */
    if (remaining >= sequence.litLength + sequence.matchLength) {
        rawSeqStore->pos++;
        return sequence;
    }
    /* Cut the sequence short (offset == 0 ==> rest is literals). */
    if (remaining <= sequence.litLength) {
        sequence.offset = 0;
    } else if (remaining < sequence.litLength + sequence.matchLength) {
        sequence.matchLength = remaining - sequence.litLength;
        if (sequence.matchLength < minMatch) {
            sequence.offset = 0;
        }
    }
    /* Skip past `remaining` bytes for the future sequences. */
    ZSTD_ldm_skipSequences(rawSeqStore, remaining, minMatch);
    return sequence;
}